

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O1

void __thiscall rtosc::UndoHistory::seekHistory(UndoHistory *this,int distance)

{
  long lVar1;
  UndoHistoryImpl *pUVar2;
  _Map_pointer pppVar3;
  ulong uVar4;
  _Elt_pointer ppVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  
  pUVar2 = this->impl;
  lVar1 = pUVar2->history_pos + (long)distance;
  iVar7 = (int)pUVar2->history_pos;
  if (lVar1 < 0) {
    distance = -iVar7;
  }
  pppVar3 = (pUVar2->history).
            super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar8 = ((long)(pUVar2->history).
                 super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)(pUVar2->history).
                 super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
          ((long)(pUVar2->history).
                 super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)(pUVar2->history).
                 super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
          ((((ulong)((long)pppVar3 -
                    (long)(pUVar2->history).
                          super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(pppVar3 == (_Map_pointer)0x0)) * 0x20;
  iVar7 = (int)lVar8 - iVar7;
  if (lVar1 <= lVar8) {
    iVar7 = distance;
  }
  if (iVar7 != 0) {
    if (iVar7 < 0) {
      do {
        pUVar2 = this->impl;
        ppVar5 = (pUVar2->history).
                 super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar8 = pUVar2->history_pos;
        lVar1 = lVar8 + -1;
        pUVar2->history_pos = lVar1;
        uVar4 = (lVar8 + ((long)ppVar5 -
                          (long)(pUVar2->history).
                                super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_first >> 4)) - 1;
        if (uVar4 < 0x20) {
          ppVar5 = ppVar5 + lVar1;
        }
        else {
          uVar6 = uVar4 >> 5 | 0xf800000000000000;
          if (0 < (long)uVar4) {
            uVar6 = uVar4 >> 5;
          }
          ppVar5 = (pUVar2->history).
                   super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node[uVar6] + uVar4 + uVar6 * -0x20;
        }
        iVar7 = iVar7 + 1;
        UndoHistoryImpl::rewind(pUVar2,(FILE *)ppVar5->second);
      } while (iVar7 != 0);
    }
    else {
      do {
        pUVar2 = this->impl;
        ppVar5 = (pUVar2->history).
                 super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar1 = pUVar2->history_pos;
        pUVar2->history_pos = lVar1 + 1;
        uVar4 = ((long)ppVar5 -
                 (long)(pUVar2->history).
                       super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + lVar1;
        if (uVar4 < 0x20) {
          ppVar5 = ppVar5 + lVar1;
        }
        else {
          uVar6 = uVar4 >> 5 | 0xf800000000000000;
          if (0 < (long)uVar4) {
            uVar6 = uVar4 >> 5;
          }
          ppVar5 = (pUVar2->history).
                   super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node[uVar6] + uVar4 + uVar6 * -0x20;
        }
        iVar7 = iVar7 + -1;
        UndoHistoryImpl::replay(pUVar2,ppVar5->second);
      } while (iVar7 != 0);
    }
  }
  return;
}

Assistant:

void UndoHistory::seekHistory(int distance)
{
    //TODO print out the events that would need to take place to get to the
    //final destination
    
    //TODO limit the distance to be to applicable sizes
    //ie ones that do not exceed the known history/future
    long dest = impl->history_pos + distance;
    if(dest < 0)
        distance -= dest;
    if(dest > (long) impl->history.size())
        distance  = impl->history.size() - impl->history_pos;
    if(!distance)
        return;
    
    //TODO account for traveling back in time
    if(distance<0)
        while(distance++)
            impl->rewind(impl->history[--impl->history_pos].second);
    else
        while(distance--)
            impl->replay(impl->history[impl->history_pos++].second);
}